

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_test.hpp
# Opt level: O3

void nestl::test::CheckListSize<nestl::has_exceptions::list<int,nestl::allocator<int>>>
               (list<int,_nestl::allocator<int>_> *l,size_t expectedSize)

{
  list_node_base *node;
  bool bVar1;
  size_type sVar2;
  list_node_base *node_00;
  bool listIsEmpty;
  bool shouldBeEmpty;
  size_t cdist;
  size_t dist;
  bool local_42;
  bool local_41;
  list_const_iterator<int> local_40;
  list_node_base *local_38;
  list_const_iterator<int> local_30;
  list_node_base *local_28;
  
  local_38 = (list_node_base *)expectedSize;
  sVar2 = impl::list<int,_nestl::allocator<int>_>::size(&l->super_list<int,_nestl::allocator<int>_>)
  ;
  if (sVar2 != expectedSize) {
    local_40.m_node =
         (list_node_base *)
         impl::list<int,_nestl::allocator<int>_>::size(&l->super_list<int,_nestl::allocator<int>_>);
    detail::print_tuple<char_const(&)[16],unsigned_long&,char_const(&)[8],unsigned_long>
              ((ostream *)&std::cerr,(char (*) [16])"expected size: ",(unsigned_long *)&local_38,
               (char (*) [8])", got: ",(unsigned_long *)&local_40);
    abort();
  }
  local_41 = expectedSize == 0;
  node = (l->super_list<int,_nestl::allocator<int>_>).m_node.m_next;
  node_00 = &(l->super_list<int,_nestl::allocator<int>_>).m_node;
  local_42 = node == node_00;
  if (local_41 != local_42) {
    detail::print_tuple<char_const(&)[27],bool&,char_const(&)[22],bool&>
              ((ostream *)&std::cerr,(char (*) [27])"list empty method returns ",&local_42,
               (char (*) [22])", while it should be ",&local_41);
    abort();
  }
  impl::list_const_iterator<int>::list_const_iterator(&local_40,node);
  impl::list_const_iterator<int>::list_const_iterator(&local_30,node_00);
  bVar1 = impl::list_const_iterator<int>::operator!=(&local_40,&local_30);
  local_28 = (list_node_base *)0x0;
  if (bVar1) {
    do {
      impl::list_const_iterator<int>::operator++(&local_40);
      local_28 = (list_node_base *)((long)&local_28->m_next + 1);
      bVar1 = impl::list_const_iterator<int>::operator!=(&local_40,&local_30);
    } while (bVar1);
  }
  if (local_28 != local_38) {
    detail::
    print_tuple<char_const(&)[38],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
              ((ostream *)&std::cerr,(char (*) [38])"distance between iterators should be ",
               (unsigned_long *)&local_38,(char (*) [16])" elements, got ",
               (unsigned_long *)&local_28,(char (*) [10])" elements");
    abort();
  }
  impl::list_const_iterator<int>::list_const_iterator(&local_40,node_00->m_next);
  impl::list_const_iterator<int>::list_const_iterator(&local_30,node_00);
  bVar1 = impl::list_const_iterator<int>::operator!=(&local_40,&local_30);
  local_40.m_node = (list_node_base *)0x0;
  if (bVar1) {
    do {
      impl::list_const_iterator<int>::operator++(&local_40);
      local_40.m_node = (list_node_base *)((long)&(local_40.m_node)->m_next + 1);
      bVar1 = impl::list_const_iterator<int>::operator!=(&local_40,&local_30);
    } while (bVar1);
  }
  if (local_40.m_node == local_38) {
    return;
  }
  detail::
  print_tuple<char_const(&)[44],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
            ((ostream *)&std::cerr,(char (*) [44])"distance between const iterators should be ",
             (unsigned_long *)&local_38,(char (*) [16])" elements, got ",(unsigned_long *)&local_40,
             (char (*) [10])" elements");
  abort();
}

Assistant:

void CheckListSize(const List& l, size_t expectedSize)
{
    if (l.size() != expectedSize)
    {
        fatal_failure("expected size: ", expectedSize, ", got: ", l.size());
    }

    bool shouldBeEmpty = (expectedSize == 0);
    bool listIsEmpty = l.empty();

    if (listIsEmpty != shouldBeEmpty)
    {
        fatal_failure("list empty method returns ", listIsEmpty, ", while it should be ", shouldBeEmpty);
    }

    size_t dist = std::distance(l.begin(), l.end());
    if (dist != expectedSize)
    {
        fatal_failure("distance between iterators should be ", expectedSize, " elements, got ", dist, " elements");
    }

    size_t cdist = std::distance(l.cbegin(), l.cend());
    if (cdist != expectedSize)
    {
        fatal_failure("distance between const iterators should be ", expectedSize, " elements, got ", cdist, " elements");
    }
}